

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O0

void feat_cmn(feat_t *fcb,mfcc_t **mfc,int32 nfr,int32 beginutt,int32 endutt)

{
  cmn_type_t local_28;
  cmn_type_t cmn_type;
  int32 endutt_local;
  int32 beginutt_local;
  int32 nfr_local;
  mfcc_t **mfc_local;
  feat_t *fcb_local;
  
  local_28 = fcb->cmn;
  if (((beginutt == 0) || (endutt == 0)) && (local_28 != CMN_NONE)) {
    local_28 = CMN_LIVE;
    fcb->cmn = CMN_LIVE;
  }
  if (local_28 == CMN_BATCH) {
    cmn(fcb->cmn_struct,mfc,fcb->varnorm,nfr);
  }
  else if ((local_28 == CMN_LIVE) && (cmn_live(fcb->cmn_struct,mfc,fcb->varnorm,nfr), endutt != 0))
  {
    cmn_live_update(fcb->cmn_struct);
  }
  return;
}

Assistant:

static void
feat_cmn(feat_t *fcb, mfcc_t **mfc, int32 nfr, int32 beginutt, int32 endutt)
{
    cmn_type_t cmn_type = fcb->cmn;

    if (!(beginutt && endutt)
        && cmn_type != CMN_NONE) /* Only cmn_prior in block computation mode. */
        fcb->cmn = cmn_type = CMN_LIVE;

    switch (cmn_type) {
    case CMN_BATCH:
        cmn(fcb->cmn_struct, mfc, fcb->varnorm, nfr);
        break;
    case CMN_LIVE:
        cmn_live(fcb->cmn_struct, mfc, fcb->varnorm, nfr);
        if (endutt)
            cmn_live_update(fcb->cmn_struct);
        break;
    default:
        ;
    }
    cep_dump_dbg(fcb, mfc, nfr, "After CMN");
}